

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

void __thiscall IrSim::buildBB(IrSim *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *this_01;
  uint uVar1;
  pointer piVar2;
  pointer pIVar3;
  pointer psVar4;
  mapped_type_conflict *pmVar5;
  ulong uVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  _Rb_tree_node_base *p_Var8;
  size_type sVar9;
  long lVar10;
  int iVar11;
  pointer piVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  pointer pIVar13;
  pointer piVar14;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_02;
  value_type_conflict1 local_58;
  int labelNo;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_48;
  int local_3c;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_38;
  
  local_58 = 0;
  pIVar13 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_48 = &this->labels;
  this_00 = &this->basicBlocks;
  __range1 = &this->labelInBB;
  local_38 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &this->functions;
  lVar10 = -(long)pIVar13;
  for (; pIVar13 !=
         (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
         super__Vector_impl_data._M_finish; pIVar13 = pIVar13 + 1) {
    iVar11 = pIVar13->kind;
    if ((iVar11 - 0x14U < 8) || (iVar11 == 0xe)) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](local_48,&(pIVar13->target).value);
      labelNo = *pmVar5;
      piVar12 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      piVar2 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](__range1,&labelNo);
      *pmVar5 = (mapped_type_conflict)((ulong)((long)piVar12 - (long)piVar2) >> 2);
      std::vector<int,_std::allocator<int>_>::push_back(this_00,&labelNo);
      local_3c = local_58 + 1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_3c);
    }
    else if (iVar11 == 0xd) {
      std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_58);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(local_38,&local_58);
    }
    local_58 = local_58 + 1;
    lVar10 = lVar10 + -0x98;
  }
  labelNo = (int)(-((long)&((this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>
                            ._M_impl.super__Vector_impl_data._M_start)->kind + lVar10) / 0x98);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&labelNo);
  piVar12 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar2 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar12 != piVar2) {
    uVar6 = (long)piVar2 - (long)piVar12 >> 2;
    lVar10 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<IrSim::buildBB()::__0>>
              (piVar12,piVar2,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)piVar2 - (long)piVar12 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<IrSim::buildBB()::__0>>
                (piVar12,piVar2);
    }
    else {
      piVar14 = piVar12 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<IrSim::buildBB()::__0>>
                (piVar12,piVar14);
      for (; piVar14 != piVar2; piVar14 = piVar14 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<IrSim::buildBB()::__0>>
                  (piVar14);
      }
    }
  }
  _Var7 = std::
          __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::erase
            (this_00,(const_iterator)_Var7._M_current,
             (const_iterator)
             (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  piVar12 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (piVar12 !=
      (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    for (p_Var8 = (this->labelInBB)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(this->labelInBB)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (piVar12,(this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,p_Var8 + 1);
      piVar12 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      *(int *)&p_Var8[1].field_0x4 = (int)((ulong)((long)_Var7._M_current - (long)piVar12) >> 2);
    }
    iVar11 = (int)((ulong)((long)(this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
    this_01 = &this->edges;
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::resize(this_01,(long)iVar11);
    for (local_58 = 0; local_58 < iVar11; local_58 = local_58 + 1) {
      pIVar3 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = (long)(this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)local_58 + 1];
      pIVar13 = pIVar3 + lVar10;
      uVar1 = pIVar3[lVar10 + -1].kind;
      if ((uVar1 < 0x1c) && ((0xff04000U >> (uVar1 & 0x1f) & 1) != 0)) {
        psVar4 = (this_01->
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar10 = (long)local_58;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](local_48,&pIVar13[-1].target.value);
        pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](__range1,pmVar5);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   (psVar4 + lVar10),pmVar5);
      }
      if (local_58 + 1 != iVar11) {
        sVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_38,
                           (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + (local_58 + 1));
        if (sVar9 == 0) {
          this_02 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    ((this_01->
                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + local_58);
          if (pIVar13->kind == 0xe) {
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](local_48,&(pIVar13->target).value);
            pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[](__range1,pmVar5);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(this_02,pmVar5);
          }
          else {
            labelNo = local_58 + 1;
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>
                      ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)this_02,&labelNo);
          }
        }
      }
    }
    return;
  }
  __assert_fail("!basicBlocks.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                ,0x4d,"void IrSim::buildBB()");
}

Assistant:

void IrSim::buildBB() {
    int i = 0;
    for (auto it = irList.begin(); it != irList.end(); ++it, ++i) {
        int k = it->kind;
        if (k == IC_FUNC) {
            basicBlocks.push_back(i);
            functions.insert(i);
        }
        else if (isGoto(k)) {
            int labelNo = labels[it->target.value];
            labelInBB[labelNo] = (int)basicBlocks.size();
            basicBlocks.push_back(labelNo);
            basicBlocks.push_back(i + 1);
        }
    }
    basicBlocks.push_back((int)irList.size());
    std::sort(basicBlocks.begin(), basicBlocks.end(), [](int a, int b) { return a <= b; });
    auto last = std::unique(basicBlocks.begin(), basicBlocks.end());
    basicBlocks.erase(last, basicBlocks.end());
    assert(!basicBlocks.empty());

    for (auto &it : labelInBB)
        it.second = (int)(find(basicBlocks.begin(), basicBlocks.end(), it.first) - basicBlocks.begin());
    int size = (int)basicBlocks.size() - 1;
    edges.resize((size_t)size);
    for (i = 0; i < size; ++i) { // build edges
        InterCode &bbend = irList[basicBlocks[i + 1] - 1];
        InterCode &bbnext = irList[basicBlocks[i + 1]];
        if (isGoto(bbend.kind))
            edges[i].insert(labelInBB[labels[bbend.target.value]]);
        if (i + 1 != size && functions.count(basicBlocks[i + 1]) == 0) {
            if (bbnext.kind == IC_GOTO)
                edges[i].insert(labelInBB[labels[bbnext.target.value]]);
            else
                edges[i].insert(i + 1);
        }
    }
}